

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasuEigen.cpp
# Opt level: O3

double Clenshaw1D<Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Array<double,1,_1,1,1,_1>const,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const>>>
                 (MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>
                  *c,double ind)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  lVar1 = (c->m_expression).m_rhs.m_cols.m_value;
  uVar2 = (uint)lVar1;
  if ((int)uVar2 < 1) {
    dVar5 = 0.0;
  }
  else {
    lVar3 = (ulong)(uVar2 & 0x7fffffff) + 1;
    dVar5 = 0.0;
    dVar6 = 0.0;
    do {
      if (lVar1 < 0) {
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0xa3,
                      "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Array<double, 1, -1>, const Eigen::Array<double, 1, -1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, 1, -1>>>>, 0>::operator[](Index) const [Derived = Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Array<double, 1, -1>, const Eigen::Array<double, 1, -1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, 1, -1>>>>, Level = 0]"
                     );
      }
      dVar4 = ((((c->m_expression).m_lhs.m_lhs)->
               super_PlainObjectBase<Eigen::Array<double,_1,__1,_1,_1,__1>_>).m_storage.m_data
               [lVar3 + -2] -
              (((c->m_expression).m_lhs.m_rhs)->
              super_PlainObjectBase<Eigen::Array<double,_1,__1,_1,_1,__1>_>).m_storage.m_data
              [lVar3 + -2]) / (c->m_expression).m_rhs.m_functor.m_other +
              ((ind + ind) * dVar6 - dVar5);
      if (lVar3 != 2) {
        dVar5 = dVar6;
        dVar6 = dVar4;
      }
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
    dVar5 = (dVar4 - dVar5) * 0.5;
  }
  return dVar5;
}

Assistant:

double Clenshaw1D(const vectype &c, double ind){
    int N = static_cast<int>(c.size()) - 1;
    double u_k = 0, u_kp1 = 0, u_kp2 = 0;
    for (int k = N; k >= 0; --k){
        // Do the recurrent calculation
        u_k = 2.0*ind*u_kp1 - u_kp2 + c[k];
        if (k > 0){
            // Update the values
            u_kp2 = u_kp1; u_kp1 = u_k;
        }
    }
    return (u_k - u_kp2)/2;
}